

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

void av1_read_color_config
               (aom_read_bit_buffer *rb,int allow_lowbitdepth,SequenceHeader *seq_params,
               aom_internal_error_info *error_info)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  aom_internal_error_info *in_RCX;
  long in_RDX;
  int in_ESI;
  int color_description_present_flag;
  int is_monochrome;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  uint uVar4;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int iVar5;
  
  read_bitdepth((aom_read_bit_buffer *)in_RCX,
                (SequenceHeader *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                (aom_internal_error_info *)
                CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  uVar4 = CONCAT13(1,(int3)in_stack_ffffffffffffffd4);
  if (*(uint *)(in_RDX + 0x48) < 9) {
    uVar4 = CONCAT13(in_ESI != 0,(int3)in_stack_ffffffffffffffd4) ^ 0xff000000;
  }
  *(byte *)(in_RDX + 0x4c) = (byte)(uVar4 >> 0x18) & 1;
  if (*(char *)(in_RDX + 0x45) == '\x01') {
    iVar1 = 0;
  }
  else {
    iVar1 = aom_rb_read_bit((aom_read_bit_buffer *)
                            CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  }
  *(char *)(in_RDX + 0x4d) = (char)iVar1;
  iVar5 = iVar1;
  uVar2 = aom_rb_read_bit((aom_read_bit_buffer *)CONCAT44(iVar1,in_stack_ffffffffffffffd8));
  if (uVar2 == 0) {
    *(undefined4 *)(in_RDX + 0x50) = 2;
    *(undefined4 *)(in_RDX + 0x54) = 2;
    *(undefined4 *)(in_RDX + 0x58) = 2;
  }
  else {
    iVar3 = aom_rb_read_literal((aom_read_bit_buffer *)CONCAT44(uVar4,iVar1),
                                in_stack_ffffffffffffffcc);
    *(int *)(in_RDX + 0x50) = iVar3;
    iVar3 = aom_rb_read_literal((aom_read_bit_buffer *)CONCAT44(uVar4,iVar1),
                                in_stack_ffffffffffffffcc);
    *(int *)(in_RDX + 0x54) = iVar3;
    iVar3 = aom_rb_read_literal((aom_read_bit_buffer *)CONCAT44(uVar4,iVar1),
                                in_stack_ffffffffffffffcc);
    *(int *)(in_RDX + 0x58) = iVar3;
  }
  if (iVar5 == 0) {
    if (((*(int *)(in_RDX + 0x50) == 1) && (*(int *)(in_RDX + 0x54) == 0xd)) &&
       (*(int *)(in_RDX + 0x58) == 0)) {
      *(undefined4 *)(in_RDX + 0x60) = 0;
      *(undefined4 *)(in_RDX + 100) = 0;
      *(undefined4 *)(in_RDX + 0x5c) = 1;
      if ((*(char *)(in_RDX + 0x45) != '\x01') &&
         ((*(char *)(in_RDX + 0x45) != '\x02' || (*(int *)(in_RDX + 0x48) != 0xc)))) {
        aom_internal_error(in_RCX,AOM_CODEC_UNSUP_BITSTREAM,
                           "sRGB colorspace not compatible with specified profile");
      }
    }
    else {
      iVar3 = aom_rb_read_bit((aom_read_bit_buffer *)(ulong)uVar2);
      *(int *)(in_RDX + 0x5c) = iVar3;
      if (*(char *)(in_RDX + 0x45) == '\0') {
        *(undefined4 *)(in_RDX + 100) = 1;
        *(undefined4 *)(in_RDX + 0x60) = 1;
      }
      else if (*(char *)(in_RDX + 0x45) == '\x01') {
        *(undefined4 *)(in_RDX + 100) = 0;
        *(undefined4 *)(in_RDX + 0x60) = 0;
      }
      else if (*(int *)(in_RDX + 0x48) == 0xc) {
        iVar3 = aom_rb_read_bit((aom_read_bit_buffer *)CONCAT44(iVar5,uVar2));
        *(int *)(in_RDX + 0x60) = iVar3;
        if (*(int *)(in_RDX + 0x60) == 0) {
          *(undefined4 *)(in_RDX + 100) = 0;
        }
        else {
          iVar3 = aom_rb_read_bit((aom_read_bit_buffer *)CONCAT44(iVar5,uVar2));
          *(int *)(in_RDX + 100) = iVar3;
        }
      }
      else {
        *(undefined4 *)(in_RDX + 0x60) = 1;
        *(undefined4 *)(in_RDX + 100) = 0;
      }
      if ((*(int *)(in_RDX + 0x58) == 0) &&
         ((*(int *)(in_RDX + 0x60) != 0 || (*(int *)(in_RDX + 100) != 0)))) {
        aom_internal_error(in_RCX,AOM_CODEC_UNSUP_BITSTREAM,
                           "Identity CICP Matrix incompatible with non 4:4:4 color sampling");
      }
      if ((*(int *)(in_RDX + 0x60) != 0) && (*(int *)(in_RDX + 100) != 0)) {
        iVar1 = aom_rb_read_literal((aom_read_bit_buffer *)CONCAT44(uVar4,iVar1),
                                    in_stack_ffffffffffffffcc);
        *(int *)(in_RDX + 0x68) = iVar1;
      }
    }
    iVar1 = aom_rb_read_bit((aom_read_bit_buffer *)CONCAT44(iVar5,uVar2));
    *(char *)(in_RDX + 0x6c) = (char)iVar1;
  }
  else {
    iVar1 = aom_rb_read_bit((aom_read_bit_buffer *)CONCAT44(iVar5,uVar2));
    *(int *)(in_RDX + 0x5c) = iVar1;
    *(undefined4 *)(in_RDX + 0x60) = 1;
    *(undefined4 *)(in_RDX + 100) = 1;
    *(undefined4 *)(in_RDX + 0x68) = 0;
    *(undefined1 *)(in_RDX + 0x6c) = 0;
  }
  return;
}

Assistant:

void av1_read_color_config(struct aom_read_bit_buffer *rb,
                           int allow_lowbitdepth, SequenceHeader *seq_params,
                           struct aom_internal_error_info *error_info) {
  read_bitdepth(rb, seq_params, error_info);

  seq_params->use_highbitdepth =
      seq_params->bit_depth > AOM_BITS_8 || !allow_lowbitdepth;
  // monochrome bit (not needed for PROFILE_1)
  const int is_monochrome =
      seq_params->profile != PROFILE_1 ? aom_rb_read_bit(rb) : 0;
  seq_params->monochrome = is_monochrome;
  int color_description_present_flag = aom_rb_read_bit(rb);
  if (color_description_present_flag) {
    seq_params->color_primaries = aom_rb_read_literal(rb, 8);
    seq_params->transfer_characteristics = aom_rb_read_literal(rb, 8);
    seq_params->matrix_coefficients = aom_rb_read_literal(rb, 8);
  } else {
    seq_params->color_primaries = AOM_CICP_CP_UNSPECIFIED;
    seq_params->transfer_characteristics = AOM_CICP_TC_UNSPECIFIED;
    seq_params->matrix_coefficients = AOM_CICP_MC_UNSPECIFIED;
  }
  if (is_monochrome) {
    // [16,235] (including xvycc) vs [0,255] range
    seq_params->color_range = aom_rb_read_bit(rb);
    seq_params->subsampling_y = seq_params->subsampling_x = 1;
    seq_params->chroma_sample_position = AOM_CSP_UNKNOWN;
    seq_params->separate_uv_delta_q = 0;
    return;
  }
  if (seq_params->color_primaries == AOM_CICP_CP_BT_709 &&
      seq_params->transfer_characteristics == AOM_CICP_TC_SRGB &&
      seq_params->matrix_coefficients == AOM_CICP_MC_IDENTITY) {
    seq_params->subsampling_y = seq_params->subsampling_x = 0;
    seq_params->color_range = 1;  // assume full color-range
    if (!(seq_params->profile == PROFILE_1 ||
          (seq_params->profile == PROFILE_2 &&
           seq_params->bit_depth == AOM_BITS_12))) {
      aom_internal_error(
          error_info, AOM_CODEC_UNSUP_BITSTREAM,
          "sRGB colorspace not compatible with specified profile");
    }
  } else {
    // [16,235] (including xvycc) vs [0,255] range
    seq_params->color_range = aom_rb_read_bit(rb);
    if (seq_params->profile == PROFILE_0) {
      // 420 only
      seq_params->subsampling_x = seq_params->subsampling_y = 1;
    } else if (seq_params->profile == PROFILE_1) {
      // 444 only
      seq_params->subsampling_x = seq_params->subsampling_y = 0;
    } else {
      assert(seq_params->profile == PROFILE_2);
      if (seq_params->bit_depth == AOM_BITS_12) {
        seq_params->subsampling_x = aom_rb_read_bit(rb);
        if (seq_params->subsampling_x)
          seq_params->subsampling_y = aom_rb_read_bit(rb);  // 422 or 420
        else
          seq_params->subsampling_y = 0;  // 444
      } else {
        // 422
        seq_params->subsampling_x = 1;
        seq_params->subsampling_y = 0;
      }
    }
    if (seq_params->matrix_coefficients == AOM_CICP_MC_IDENTITY &&
        (seq_params->subsampling_x || seq_params->subsampling_y)) {
      aom_internal_error(
          error_info, AOM_CODEC_UNSUP_BITSTREAM,
          "Identity CICP Matrix incompatible with non 4:4:4 color sampling");
    }
    if (seq_params->subsampling_x && seq_params->subsampling_y) {
      seq_params->chroma_sample_position = aom_rb_read_literal(rb, 2);
    }
  }
  seq_params->separate_uv_delta_q = aom_rb_read_bit(rb);
}